

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

void VP8Clear(VP8Decoder *dec)

{
  WebPWorkerInterface *pWVar1;
  
  if (dec != (VP8Decoder *)0x0) {
    pWVar1 = WebPGetWorkerInterface();
    (*pWVar1->End)(&dec->worker_);
    WebPDeallocateAlphaMemory(dec);
    WebPSafeFree(dec->mem_);
    (dec->br_).buf_max_ = (uint8_t *)0x0;
    *(undefined8 *)&(dec->br_).eof_ = 0;
    (dec->br_).buf_ = (uint8_t *)0x0;
    (dec->br_).buf_end_ = (uint8_t *)0x0;
    (dec->br_).value_ = 0;
    (dec->br_).range_ = 0;
    (dec->br_).bits_ = 0;
    dec->ready_ = 0;
    dec->mem_ = (void *)0x0;
    dec->mem_size_ = 0;
  }
  return;
}

Assistant:

void VP8Clear(VP8Decoder* const dec) {
  if (dec == NULL) {
    return;
  }
  WebPGetWorkerInterface()->End(&dec->worker_);
  WebPDeallocateAlphaMemory(dec);
  WebPSafeFree(dec->mem_);
  dec->mem_ = NULL;
  dec->mem_size_ = 0;
  memset(&dec->br_, 0, sizeof(dec->br_));
  dec->ready_ = 0;
}